

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_haddps_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  float32 local_60;
  float32 local_5c;
  ZMMReg r;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  r._q_ZMMReg[7] = (uint64_t)s;
  s_local = d;
  d_local = (ZMMReg *)env;
  local_60 = float32_add_x86_64(d->_s_ZMMReg[0],d->_s_ZMMReg[1],&env->sse_status);
  local_5c = float32_add_x86_64(s_local->_s_ZMMReg[2],s_local->_s_ZMMReg[3],
                                (float_status *)((long)d_local + 0x308));
  r._s_ZMMReg[0] =
       float32_add_x86_64(*(float32 *)r._q_ZMMReg[7],*(float32 *)(r._q_ZMMReg[7] + 4),
                          (float_status *)((long)d_local + 0x308));
  r._s_ZMMReg[1] =
       float32_add_x86_64(*(float32 *)(r._q_ZMMReg[7] + 8),*(float32 *)(r._q_ZMMReg[7] + 0xc),
                          (float_status *)((long)d_local + 0x308));
  memcpy(s_local,&local_60,0x40);
  return;
}

Assistant:

void helper_haddps(CPUX86State *env, ZMMReg *d, ZMMReg *s)
{
    ZMMReg r;

    r.ZMM_S(0) = float32_add(d->ZMM_S(0), d->ZMM_S(1), &env->sse_status);
    r.ZMM_S(1) = float32_add(d->ZMM_S(2), d->ZMM_S(3), &env->sse_status);
    r.ZMM_S(2) = float32_add(s->ZMM_S(0), s->ZMM_S(1), &env->sse_status);
    r.ZMM_S(3) = float32_add(s->ZMM_S(2), s->ZMM_S(3), &env->sse_status);
    *d = r;
}